

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Daemon.cpp
# Opt level: O2

Response execute_command(DatasetDropCommand *cmd,Task *task,DatabaseSnapshot *snap)

{
  Response RVar1;
  allocator<char> local_95;
  DbChangeType local_94;
  string local_90;
  DBChange local_70;
  
  local_94 = Drop;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"",&local_95);
  DBChange::DBChange(&local_70,&local_94,(string *)task,&local_90);
  std::vector<DBChange,_std::allocator<DBChange>_>::emplace_back<DBChange>
            ((vector<DBChange,_std::allocator<DBChange>_> *)
             &(snap->db_name)._M_pathname._M_string_length,&local_70);
  DBChange::~DBChange(&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  RVar1 = Response::ok();
  RVar1.content._0_8_ = cmd;
  return (Response)RVar1.content;
}

Assistant:

Response execute_command(const DatasetDropCommand &cmd, Task *task,
                         [[maybe_unused]] const DatabaseSnapshot *snap) {
    task->change(DBChange(DbChangeType::Drop, cmd.dataset_id()));

    return Response::ok();
}